

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::mrg3s_&,_const_trng::mrg3s_&> * __thiscall
Catch::ExprLhs<trng::mrg3s_const&>::operator!=(ExprLhs<const_trng::mrg3s_&> *this,mrg3s *rhs)

{
  StringRef op;
  bool comparisonResult;
  mrg3s *in_RSI;
  BinaryExpr<const_trng::mrg3s_&,_const_trng::mrg3s_&> *in_RDI;
  mrg3s *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_trng::mrg3s_&,_const_trng::mrg3s_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareNotEqual<trng::mrg3s,trng::mrg3s_const&>(in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = *(char **)(in_RSI->P).a;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_trng::mrg3s_&,_const_trng::mrg3s_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }